

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Tri::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Tri *this)

{
  uint32_t uVar1;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_00;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l_01;
  SingleMthdTest *pSVar2;
  result_type rVar3;
  MthdNotify *this_00;
  MthdPatch *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdCtxClip *this_04;
  MthdCtxPattern *this_05;
  MthdCtxRop *this_06;
  MthdCtxBeta *this_07;
  MthdMissing *this_08;
  MthdOperation *this_09;
  MthdSolidFormat *this_10;
  MthdSolidColor *pMVar4;
  MthdVtxXy *pMVar5;
  MthdVtxX32 *pMVar6;
  MthdVtxY32 *pMVar7;
  MthdCtxSurf *this_11;
  MthdCtxSurf2D *this_12;
  allocator local_6e1;
  string local_6e0 [38];
  undefined1 local_6ba;
  allocator local_6b9;
  string local_6b8 [32];
  SingleMthdTest *local_698;
  MthdCtxSurf2D *local_690;
  iterator local_688;
  undefined8 local_680;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_678;
  const_iterator local_670;
  SingleMthdTest **local_668;
  undefined1 local_65a;
  allocator local_659;
  string local_658 [32];
  MthdCtxSurf *local_638;
  MthdCtxSurf **local_630;
  undefined8 local_628;
  __normal_iterator<hwtest::pgraph::SingleMthdTest_**,_std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>_>
  local_620;
  const_iterator local_618;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_60b;
  undefined1 local_60a;
  allocator local_609;
  string local_608 [38];
  undefined1 local_5e2;
  allocator local_5e1;
  string local_5e0 [38];
  undefined1 local_5ba;
  allocator local_5b9;
  string local_5b8 [38];
  undefined1 local_592;
  allocator local_591;
  string local_590 [38];
  undefined1 local_56a;
  allocator local_569;
  string local_568 [38];
  undefined1 local_542;
  allocator local_541;
  string local_540 [38];
  undefined1 local_51a;
  allocator local_519;
  string local_518 [38];
  undefined1 local_4f2;
  allocator local_4f1;
  string local_4f0 [38];
  undefined1 local_4ca;
  allocator local_4c9;
  string local_4c8 [38];
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [38];
  undefined1 local_47a;
  allocator local_479;
  string local_478 [38];
  undefined1 local_452;
  allocator local_451;
  string local_450 [38];
  undefined1 local_42a;
  allocator local_429;
  string local_428 [38];
  undefined1 local_402;
  allocator local_401;
  string local_400 [38];
  undefined1 local_3da;
  allocator local_3d9;
  string local_3d8 [38];
  undefined1 local_3b2;
  allocator local_3b1;
  string local_3b0 [38];
  undefined1 local_38a;
  allocator local_389;
  string local_388 [38];
  undefined1 local_362;
  allocator local_361;
  string local_360 [38];
  undefined1 local_33a;
  allocator local_339;
  string local_338 [38];
  undefined1 local_312;
  allocator local_311;
  string local_310 [38];
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [38];
  undefined1 local_272;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [38];
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [38];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [48];
  SingleMthdTest *local_128;
  MthdNotify *local_120;
  MthdPatch *local_118;
  MthdPmTrigger *local_110;
  MthdDmaNotify *local_108;
  MthdCtxClip *local_100;
  MthdCtxPattern *local_f8;
  MthdCtxRop *local_f0;
  MthdCtxBeta *local_e8;
  MthdMissing *local_e0;
  MthdOperation *local_d8;
  MthdSolidFormat *local_d0;
  MthdSolidColor *local_c8;
  MthdVtxXy *local_c0;
  MthdVtxXy *local_b8;
  MthdVtxXy *local_b0;
  MthdVtxX32 *local_a8;
  MthdVtxY32 *local_a0;
  MthdVtxX32 *local_98;
  MthdVtxY32 *local_90;
  MthdVtxX32 *local_88;
  MthdVtxY32 *local_80;
  MthdVtxXy *local_78;
  MthdVtxX32 *local_70;
  MthdVtxY32 *local_68;
  MthdSolidColor *local_60;
  MthdVtxXy *local_58;
  MthdVtxXy *local_50;
  MthdVtxXy *local_48;
  MthdSolidColor *local_40;
  MthdVtxXy *local_38;
  iterator local_30;
  size_type local_28;
  undefined1 local_19;
  Tri *local_18;
  Tri *this_local;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *res;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Tri *)__return_storage_ptr__;
  pSVar2 = (SingleMthdTest *)operator_new(0x25950);
  local_15a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"nop",&local_159);
  MthdNop::SingleMthdTest
            ((MthdNop *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_158,-1,
             (this->super_Class).cls,0x100,1,4);
  local_15a = 0;
  local_128 = pSVar2;
  this_00 = (MthdNotify *)operator_new(0x25950);
  local_182 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"notify",&local_181);
  MthdNotify::SingleMthdTest
            (this_00,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_180,0,
             (this->super_Class).cls,0x104,1,4);
  local_182 = 0;
  local_120 = this_00;
  this_01 = (MthdPatch *)operator_new(0x25950);
  local_1aa = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"patch",&local_1a9);
  MthdPatch::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1a8,-1,
             (this->super_Class).cls,0x10c,1,4);
  local_1aa = 0;
  local_118 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_1d2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"pm_trigger",&local_1d1);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1d0,-1,
             (this->super_Class).cls,0x140,1,4);
  local_1d2 = 0;
  local_110 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_1fa = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"dma_notify",&local_1f9);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_1f8,1,
             (this->super_Class).cls,0x180,1,4);
  local_1fa = 0;
  local_108 = this_03;
  this_04 = (MthdCtxClip *)operator_new(0x25950);
  local_222 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"ctx_clip",&local_221);
  MthdCtxClip::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_220,2,
             (this->super_Class).cls,0x184,1,4);
  local_222 = 0;
  local_100 = this_04;
  this_05 = (MthdCtxPattern *)operator_new(0x25958);
  local_24a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"ctx_pattern",&local_249);
  uVar1 = (this->super_Class).cls;
  MthdCtxPattern::MthdCtxPattern
            (this_05,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_248,3,uVar1,0x188,
             uVar1 != 0x1d);
  local_24a = 0;
  local_f8 = this_05;
  this_06 = (MthdCtxRop *)operator_new(0x25950);
  local_272 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"ctx_rop",&local_271);
  MthdCtxRop::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_270,4,
             (this->super_Class).cls,0x18c,1,4);
  local_272 = 0;
  local_f0 = this_06;
  this_07 = (MthdCtxBeta *)operator_new(0x25950);
  local_29a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"ctx_beta",&local_299);
  MthdCtxBeta::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_298,5,
             (this->super_Class).cls,400,1,4);
  local_29a = 0;
  local_e8 = this_07;
  this_08 = (MthdMissing *)operator_new(0x25950);
  local_2c2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"missing",&local_2c1);
  MthdMissing::SingleMthdTest
            (this_08,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2c0,-1,
             (this->super_Class).cls,0x200,1,4);
  local_2c2 = 0;
  local_e0 = this_08;
  this_09 = (MthdOperation *)operator_new(0x25958);
  local_2ea = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"operation",&local_2e9);
  uVar1 = (this->super_Class).cls;
  MthdOperation::MthdOperation
            (this_09,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_2e8,8,uVar1,0x2fc,
             uVar1 != 0x1d);
  local_2ea = 0;
  local_d8 = this_09;
  this_10 = (MthdSolidFormat *)operator_new(0x25958);
  local_312 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"format",&local_311);
  uVar1 = (this->super_Class).cls;
  MthdSolidFormat::MthdSolidFormat
            (this_10,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_310,9,uVar1,0x300,
             uVar1 != 0x1d);
  local_312 = 0;
  local_d0 = this_10;
  pMVar4 = (MthdSolidColor *)operator_new(0x25950);
  local_33a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"color",&local_339);
  MthdSolidColor::SingleMthdTest
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_338,10,
             (this->super_Class).cls,0x304,1,4);
  local_33a = 0;
  local_c8 = pMVar4;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_362 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_360,"triangle.0.xy",&local_361);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_360,0xb,
             (this->super_Class).cls,0x310,1,4,1);
  local_362 = 0;
  local_c0 = pMVar5;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_38a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"triangle.1.xy",&local_389);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_388,0xc,
             (this->super_Class).cls,0x314,1,4,0);
  local_38a = 0;
  local_b8 = pMVar5;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_3b2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"triangle.2.xy",&local_3b1);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3b0,0xd,
             (this->super_Class).cls,0x318,1,4,4);
  local_3b2 = 0;
  local_b0 = pMVar5;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_3da = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"triangle32.0.x",&local_3d9);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_3d8,0xe,
             (this->super_Class).cls,800,1,4,1);
  local_3da = 0;
  local_a8 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_402 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"triangle32.0.y",&local_401);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_400,0xf,
             (this->super_Class).cls,0x324,1,4,1);
  local_402 = 0;
  local_a0 = pMVar7;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_42a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"triangle32.1.x",&local_429);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_428,0x10,
             (this->super_Class).cls,0x328,1,4,0);
  local_42a = 0;
  local_98 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_452 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"triangle32.1.y",&local_451);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_450,0x11,
             (this->super_Class).cls,0x32c,1,4,0);
  local_452 = 0;
  local_90 = pMVar7;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_47a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"triangle32.2.x",&local_479);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_478,0x12,
             (this->super_Class).cls,0x330,1,4,4);
  local_47a = 0;
  local_88 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_4a2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"triangle32.2.y",&local_4a1);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_4a0,0x13,
             (this->super_Class).cls,0x334,1,4,4);
  local_4a2 = 0;
  local_80 = pMVar7;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_4ca = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"polytri.xy",&local_4c9);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_4c8,0x14,
             (this->super_Class).cls,0x400,0x20,4,6);
  local_4ca = 0;
  local_78 = pMVar5;
  pMVar6 = (MthdVtxX32 *)operator_new(0x25958);
  local_4f2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"polytri32.x",&local_4f1);
  MthdVtxX32::MthdVtxX32
            (pMVar6,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_4f0,0x15,
             (this->super_Class).cls,0x480,0x10,8,6);
  local_4f2 = 0;
  local_70 = pMVar6;
  pMVar7 = (MthdVtxY32 *)operator_new(0x25958);
  local_51a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"polytri32.y",&local_519);
  MthdVtxY32::MthdVtxY32
            (pMVar7,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_518,0x16,
             (this->super_Class).cls,0x484,0x10,8,6);
  local_51a = 0;
  local_68 = pMVar7;
  pMVar4 = (MthdSolidColor *)operator_new(0x25950);
  local_542 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"ctriangle.color",&local_541);
  MthdSolidColor::SingleMthdTest
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_540,0x17,
             (this->super_Class).cls,0x500,8,0x10);
  local_542 = 0;
  local_60 = pMVar4;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_56a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"ctriangle.0.xy",&local_569);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_568,0x18,
             (this->super_Class).cls,0x504,8,0x10,1);
  local_56a = 0;
  local_58 = pMVar5;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_592 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_590,"ctriangle.1.xy",&local_591);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_590,0x19,
             (this->super_Class).cls,0x508,8,0x10,0);
  local_592 = 0;
  local_50 = pMVar5;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_5ba = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5b8,"ctriangle.2.xy",&local_5b9);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_5b8,0x1a,
             (this->super_Class).cls,0x50c,8,0x10,4);
  local_5ba = 0;
  local_48 = pMVar5;
  pMVar4 = (MthdSolidColor *)operator_new(0x25950);
  local_5e2 = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"cpolytri.color",&local_5e1);
  MthdSolidColor::SingleMthdTest
            (pMVar4,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_5e0,0x1b,
             (this->super_Class).cls,0x580,0x10,8);
  local_5e2 = 0;
  local_40 = pMVar4;
  pMVar5 = (MthdVtxXy *)operator_new(0x25958);
  local_60a = 1;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"cpolytri.xy",&local_609);
  MthdVtxXy::MthdVtxXy
            (pMVar5,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_608,0x1c,
             (this->super_Class).cls,0x584,0x10,8,6);
  local_60a = 0;
  local_30 = &local_128;
  local_28 = 0x1f;
  local_38 = pMVar5;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_60b);
  __l_01._M_len = local_28;
  __l_01._M_array = local_30;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l_01,&local_60b);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_60b);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  if ((this->super_Class).cls == 0x1d) {
    local_620._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_618,&local_620);
    this_11 = (MthdCtxSurf *)operator_new(0x25958);
    local_65a = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_658,"ctx_dst",&local_659);
    MthdCtxSurf::MthdCtxSurf
              (this_11,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_658,7,
               (this->super_Class).cls,0x194,0);
    local_65a = 0;
    local_630 = &local_638;
    local_628 = 1;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_630;
    local_638 = this_11;
    local_668 = (SingleMthdTest **)
                std::
                vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
                ::insert(__return_storage_ptr__,local_618,__l_00);
    std::__cxx11::string::~string(local_658);
    std::allocator<char>::~allocator((allocator<char> *)&local_659);
  }
  else {
    local_678._M_current =
         (SingleMthdTest **)
         std::
         vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
         ::end(__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
    ::__normal_iterator<hwtest::pgraph::SingleMthdTest**>
              ((__normal_iterator<hwtest::pgraph::SingleMthdTest*const*,std::vector<hwtest::pgraph::SingleMthdTest*,std::allocator<hwtest::pgraph::SingleMthdTest*>>>
                *)&local_670,&local_678);
    pSVar2 = (SingleMthdTest *)operator_new(0x25950);
    local_6ba = 1;
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6b8,"ctx_beta4",&local_6b9);
    MthdCtxBeta4::SingleMthdTest
              ((MthdCtxBeta4 *)pSVar2,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_6b8,6
               ,(this->super_Class).cls,0x194,1,4);
    local_6ba = 0;
    local_698 = pSVar2;
    this_12 = (MthdCtxSurf2D *)operator_new(0x25958);
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(&(this->super_Class).rnd);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6e0,"ctx_surf2d",&local_6e1);
    MthdCtxSurf2D::MthdCtxSurf2D
              (this_12,&(this->super_Class).opt,(uint32_t)rVar3,(string *)local_6e0,7,
               (this->super_Class).cls,0x198,1);
    local_688 = &local_698;
    local_680 = 2;
    __l._M_len = 2;
    __l._M_array = local_688;
    local_690 = this_12;
    std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
    ::insert(__return_storage_ptr__,local_670,__l);
    std::__cxx11::string::~string(local_6e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
    std::__cxx11::string::~string(local_6b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Tri::mthds() {
	std::vector<SingleMthdTest *> res = {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxClip(opt, rnd(), "ctx_clip", 2, cls, 0x184),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x188, cls != 0x1d),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x18c),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x190),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, cls != 0x1d),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, cls != 0x1d),
		new MthdSolidColor(opt, rnd(), "color", 10, cls, 0x304),
		new MthdVtxXy(opt, rnd(), "triangle.0.xy", 11, cls, 0x310, 1, 4, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "triangle.1.xy", 12, cls, 0x314, 1, 4, 0),
		new MthdVtxXy(opt, rnd(), "triangle.2.xy", 13, cls, 0x318, 1, 4, VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "triangle32.0.x", 14, cls, 0x320, 1, 4, VTX_FIRST),
		new MthdVtxY32(opt, rnd(), "triangle32.0.y", 15, cls, 0x324, 1, 4, VTX_FIRST),
		new MthdVtxX32(opt, rnd(), "triangle32.1.x", 16, cls, 0x328, 1, 4, 0),
		new MthdVtxY32(opt, rnd(), "triangle32.1.y", 17, cls, 0x32c, 1, 4, 0),
		new MthdVtxX32(opt, rnd(), "triangle32.2.x", 18, cls, 0x330, 1, 4, VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "triangle32.2.y", 19, cls, 0x334, 1, 4, VTX_DRAW),
		new MthdVtxXy(opt, rnd(), "polytri.xy", 20, cls, 0x400, 0x20, 4, VTX_POLY | VTX_DRAW),
		new MthdVtxX32(opt, rnd(), "polytri32.x", 21, cls, 0x480, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdVtxY32(opt, rnd(), "polytri32.y", 22, cls, 0x484, 0x10, 8, VTX_POLY | VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "ctriangle.color", 23, cls, 0x500, 8, 0x10),
		new MthdVtxXy(opt, rnd(), "ctriangle.0.xy", 24, cls, 0x504, 8, 0x10, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "ctriangle.1.xy", 25, cls, 0x508, 8, 0x10, 0),
		new MthdVtxXy(opt, rnd(), "ctriangle.2.xy", 26, cls, 0x50c, 8, 0x10, VTX_DRAW),
		new MthdSolidColor(opt, rnd(), "cpolytri.color", 27, cls, 0x580, 0x10, 8),
		new MthdVtxXy(opt, rnd(), "cpolytri.xy", 28, cls, 0x584, 0x10, 8, VTX_POLY | VTX_DRAW),
	};
	if (cls == 0x1d) {
		res.insert(res.end(), {
			new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x194, 0),
		});
	} else {
		res.insert(res.end(), {
			new MthdCtxBeta4(opt, rnd(), "ctx_beta4", 6, cls, 0x194),
			new MthdCtxSurf2D(opt, rnd(), "ctx_surf2d", 7, cls, 0x198, SURF2D_NV10),
		});
	}
	return res;
}